

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcases.c
# Opt level: O3

int test_json2map_jsonNull(void)

{
  char *data;
  json2map_t *obj;
  int iVar1;
  
  data = (char *)calloc(0x1fe,0xff);
  obj = json2map_init('\0');
  json2map_registerDataHook(obj,data,json2map_hookMethod);
  json2map_parse(obj,(char *)0x0,(char *)0x0);
  printf("Expected: \t%s\nActual: \t%s\n\n","",data);
  iVar1 = 1;
  if (*data == '\0') {
    printf("Expected: \t%s\nActual: \t%s\n\n","",data + 0xff);
    if (data[0xff] == '\0') {
      json2map_destroy(obj);
      free(data);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int test_json2map_jsonNull() {
	keyvalue_t *map = (keyvalue_t *) calloc(sizeof(keyvalue_t), LIST_SIZE);

	json2map_t *json2mapObj = json2map_init(0);
	json2map_registerDataHook(json2mapObj, map, &json2map_hookMethod);
	json2map_parse(json2mapObj, NULL, NULL);

	ASSERTSTR("", map[0].key);
	ASSERTSTR("", map[0].value);

	json2map_destroy(json2mapObj);
	free(map);
	return 0;
}